

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  undefined8 *puVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  int32_t *ptr_03;
  int32_t *ptr_04;
  int32_t *ptr_05;
  int32_t *ptr_06;
  int32_t *ptr_07;
  int32_t *ptr_08;
  ulong uVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  char *pcVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  char *__format;
  uint uVar31;
  uint uVar32;
  int32_t iVar33;
  ulong uVar34;
  bool bVar35;
  int iVar36;
  int iVar41;
  int iVar42;
  int iVar43;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar44;
  uint uVar45;
  int iVar49;
  int iVar51;
  undefined1 auVar46 [16];
  uint uVar50;
  uint uVar52;
  uint uVar53;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar54;
  uint uVar55;
  int iVar59;
  uint uVar60;
  int iVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar65;
  int iVar71;
  uint uVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar74;
  undefined1 auVar68 [16];
  int iVar73;
  int iVar75;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined8 uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  long lVar91;
  uint uVar92;
  uint uVar94;
  uint uVar95;
  uint uVar97;
  undefined1 auVar93 [16];
  long lVar96;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar100;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  __m128i vWH;
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  int32_t in_stack_fffffffffffffca8;
  uint local_32c;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  undefined1 local_258 [16];
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  ulong uStack_1c0;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar26 = "_s2";
LAB_006ce2dd:
    fprintf(_stderr,__format,"parasail_nw_stats_rowcol_diag_sse41_128_32",pcVar26);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar26 = "s2Len";
    goto LAB_006ce2dd;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar26 = "open";
    goto LAB_006ce2dd;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar26 = "gap";
    goto LAB_006ce2dd;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar26 = "matrix";
    goto LAB_006ce2dd;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_nw_stats_rowcol_diag_sse41_128_32");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar26 = "_s1";
      goto LAB_006ce2dd;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar26 = "_s1Len";
      goto LAB_006ce2dd;
    }
    if (matrix->type == 0) goto LAB_006cd42c;
  }
  _s1Len = matrix->length;
LAB_006cd42c:
  iVar29 = -open;
  iVar30 = matrix->min;
  uVar31 = 0x80000000 - iVar30;
  if (iVar30 != iVar29 && SBORROW4(iVar30,iVar29) == iVar30 + open < 0) {
    uVar31 = open | 0x80000000;
  }
  uVar16 = 0x7ffffffe - matrix->max;
  ppVar19 = parasail_result_new_rowcol3(_s1Len,s2Len);
  if (ppVar19 != (parasail_result_t *)0x0) {
    ppVar19->flag = ppVar19->flag | 0x4451001;
    ptr = parasail_memalign_int32_t(0x10,(long)(int)(_s1Len + 3));
    uVar20 = (ulong)(s2Len + 6);
    ptr_00 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_01 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_02 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_03 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_04 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_05 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_06 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_07 = parasail_memalign_int32_t(0x10,uVar20);
    ptr_08 = parasail_memalign_int32_t(0x10,uVar20);
    auVar68._0_8_ = -(ulong)(ptr == (int32_t *)0x0);
    auVar68._8_8_ = -(ulong)(ptr_00 == (int32_t *)0x0);
    auVar66._0_8_ = -(ulong)(ptr_01 == (int32_t *)0x0);
    auVar66._8_8_ = -(ulong)(ptr_02 == (int32_t *)0x0);
    auVar66 = packssdw(auVar68,auVar66);
    auVar77._0_8_ = -(ulong)(ptr_03 == (int32_t *)0x0);
    auVar77._8_8_ = -(ulong)(ptr_04 == (int32_t *)0x0);
    auVar46._0_8_ = -(ulong)(ptr_05 == (int32_t *)0x0);
    auVar46._8_8_ = -(ulong)(ptr_06 == (int32_t *)0x0);
    auVar46 = packssdw(auVar77,auVar46);
    auVar46 = packssdw(auVar66,auVar46);
    uVar20 = 0;
    if ((ptr_08 != (int32_t *)0x0 && ptr_07 != (int32_t *)0x0) &&
        ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar46 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar46 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar46 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar46 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar46 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar46 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar46 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar46 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar46 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar46 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar46 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar46[0xf]))
    {
      uVar24 = (ulong)(uint)s2Len;
      uVar18 = s2Len + 3;
      local_32c = _s1Len - 1;
      iVar30 = s2Len + -1;
      uVar31 = uVar31 + 1;
      iStack_240 = iVar29 - gap;
      iStack_244 = iVar29 + gap * -2;
      local_248 = gap * -3 - open;
      uVar25 = 0;
      if (0 < _s1Len) {
        uVar25 = (ulong)(uint)_s1Len;
      }
      for (; uVar25 != uVar20; uVar20 = uVar20 + 1) {
        ptr[uVar20] = matrix->mapper[(byte)_s1[uVar20]];
      }
      lVar21 = (long)_s1Len;
      for (lVar22 = lVar21; lVar22 < (int)(_s1Len + 3); lVar22 = lVar22 + 1) {
        ptr[lVar22] = 0;
      }
      piVar4 = matrix->mapper;
      for (uVar20 = 0; uVar24 != uVar20; uVar20 = uVar20 + 1) {
        ptr_00[uVar20 + 3] = piVar4[(byte)_s2[uVar20]];
      }
      for (lVar22 = 0; uVar20 = uVar24, lVar22 != 3; lVar22 = lVar22 + 1) {
        ptr_00[lVar22] = 0;
      }
      for (; (int)uVar20 < (int)uVar18; uVar20 = uVar20 + 1) {
        ptr_00[uVar20 + 3] = 0;
      }
      iVar27 = iVar29;
      for (lVar22 = 0; uVar24 * 4 - lVar22 != 0; lVar22 = lVar22 + 4) {
        *(int *)((long)ptr_01 + lVar22 + 0xc) = iVar27;
        *(undefined4 *)((long)ptr_02 + lVar22 + 0xc) = 0;
        *(undefined4 *)((long)ptr_03 + lVar22 + 0xc) = 0;
        *(undefined4 *)((long)ptr_04 + lVar22 + 0xc) = 0;
        *(uint *)((long)ptr_05 + lVar22 + 0xc) = uVar31;
        *(undefined4 *)((long)ptr_06 + lVar22 + 0xc) = 0;
        *(undefined4 *)((long)ptr_07 + lVar22 + 0xc) = 0;
        *(undefined4 *)((long)ptr_08 + lVar22 + 0xc) = 0;
        iVar27 = iVar27 - gap;
      }
      for (lVar22 = 0; lVar22 != 0xc; lVar22 = lVar22 + 4) {
        *(undefined4 *)((long)ptr_01 + lVar22) = 0;
        *(undefined4 *)((long)ptr_02 + lVar22) = 0;
        *(undefined4 *)((long)ptr_03 + lVar22) = 0;
        *(undefined4 *)((long)ptr_04 + lVar22) = 0;
        *(undefined4 *)((long)ptr_05 + lVar22) = 0;
        *(undefined4 *)((long)ptr_06 + lVar22) = 0;
        *(undefined4 *)((long)ptr_07 + lVar22) = 0;
        *(undefined4 *)((long)ptr_08 + lVar22) = 0;
      }
      for (lVar22 = 0; s2Len + (int)lVar22 < (int)uVar18; lVar22 = lVar22 + 1) {
        ptr_01[uVar24 + lVar22 + 3] = 0;
        ptr_02[uVar24 + lVar22 + 3] = 0;
        ptr_03[uVar24 + lVar22 + 3] = 0;
        ptr_04[uVar24 + lVar22 + 3] = 0;
        ptr_05[uVar24 + lVar22 + 3] = 0;
        ptr_06[uVar24 + lVar22 + 3] = 0;
        ptr_07[uVar24 + lVar22 + 3] = 0;
        ptr_08[uVar24 + lVar22 + 3] = 0;
      }
      ptr_01[2] = 0;
      uVar20 = (ulong)uVar18;
      if ((int)uVar18 < 1) {
        uVar20 = 0;
      }
      auVar67 = pmovsxbd(auVar46,0x10203);
      auVar58._4_4_ = uVar31;
      auVar58._0_4_ = uVar31;
      auVar58._8_4_ = uVar31;
      auVar58._12_4_ = uVar31;
      uVar24 = 0;
      auVar89 = auVar58;
      auVar90 = auVar58;
      auVar93 = auVar58;
      local_258 = auVar58;
      iStack_23c = iVar29;
      local_268 = uVar16;
      uStack_264 = uVar16;
      uStack_260 = uVar16;
      uStack_25c = uVar16;
      while ((long)uVar24 < lVar21) {
        uVar18 = (uint)uVar24;
        if (matrix->type == 0) {
          uVar23 = ptr[uVar24 + 1];
          uVar28 = ptr[uVar24 + 2];
          uVar32 = ptr[uVar24];
          uVar17 = ptr[uVar24 + 3];
        }
        else {
          uVar23 = uVar18 | 1;
          if (lVar21 <= (long)(uVar24 | 1)) {
            uVar23 = local_32c;
          }
          uVar28 = uVar18 | 2;
          if (lVar21 <= (long)(uVar24 | 2)) {
            uVar28 = local_32c;
          }
          uVar32 = uVar18;
          uVar17 = uVar18 | 3;
          if (lVar21 <= (long)(uVar24 | 3)) {
            uVar17 = local_32c;
          }
        }
        puVar1 = (uint *)(ptr + uVar24);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        uVar12 = puVar1[2];
        uVar13 = puVar1[3];
        piVar4 = matrix->matrix;
        iVar27 = matrix->size;
        iVar33 = ptr_01[2];
        auVar103 = ZEXT416(iVar29 - uVar18 * gap) << 0x60;
        ptr_01[2] = iVar29 - (int)(uVar24 + 4) * gap;
        local_1e8 = (undefined1  [16])0x0;
        uVar18 = auVar67._4_4_;
        uVar72 = auVar67._8_4_;
        uVar74 = auVar67._12_4_;
        local_1f8 = (undefined1  [16])0x0;
        auVar68 = (undefined1  [16])0x0;
        auVar66 = (undefined1  [16])0x0;
        local_2b8 = (undefined1  [16])0x0;
        auVar46 = (undefined1  [16])0x0;
        auVar77 = ZEXT816(0);
        auVar82 = ZEXT816(0);
        auVar110 = (undefined1  [16])0x0;
        auVar112 = (undefined1  [16])0x0;
        local_2a8 = (undefined1  [16])0x0;
        local_2c8 = -3;
        iStack_2c4 = -2;
        iStack_2c0 = -1;
        iStack_2bc = 0;
        auVar76 = ZEXT416(uVar31) << 0x60;
        iVar44 = 0;
        iVar49 = 0;
        iVar51 = 0;
        uVar81 = 0;
        uVar25 = 0;
        local_1d8 = ZEXT416(uVar31) << 0x60;
        local_1c8 = CONCAT44(uVar31,uVar31);
        uStack_1c0 = CONCAT44(uVar31,uVar31);
        for (uVar34 = 0; uVar20 != uVar34; uVar34 = uVar34 + 1) {
          iVar104 = auVar103._4_4_;
          iVar106 = auVar103._8_4_;
          iVar108 = auVar103._12_4_;
          iVar2 = ptr_01[uVar34 + 3];
          auVar99._0_8_ = auVar68._4_8_;
          auVar98._0_12_ = auVar68._4_12_;
          auVar98._12_4_ = auVar68._12_4_;
          uVar7 = auVar98._8_8_ & 0xffffffff | (ulong)(uint)ptr_02[uVar34 + 3] << 0x20;
          auVar99._8_8_ = uVar7;
          auVar83._12_4_ = auVar66._12_4_;
          auVar84._0_8_ = auVar66._4_8_;
          auVar83._0_12_ = auVar66._4_12_;
          uVar8 = auVar83._8_8_ & 0xffffffff | (ulong)(uint)ptr_03[uVar34 + 3] << 0x20;
          auVar84._8_8_ = uVar8;
          auVar111._0_8_ = auVar110._4_8_;
          auVar110._0_12_ = auVar110._4_12_;
          auVar111._8_8_ = auVar110._8_8_ & 0xffffffff | (ulong)(uint)ptr_06[uVar34 + 3] << 0x20;
          auVar113._0_8_ = auVar112._4_8_;
          auVar112._0_12_ = auVar112._4_12_;
          auVar113._8_8_ = auVar112._8_8_ & 0xffffffff | (ulong)(uint)ptr_07[uVar34 + 3] << 0x20;
          iVar36 = iVar104 - open;
          iVar41 = iVar106 - open;
          iVar42 = iVar108 - open;
          iVar43 = iVar2 - open;
          iVar54 = auVar76._4_4_ - gap;
          iVar59 = auVar76._8_4_ - gap;
          iVar61 = auVar76._12_4_ - gap;
          iVar63 = ptr_05[uVar34 + 3] - gap;
          auVar37._0_4_ = -(uint)(iVar54 < iVar36);
          auVar37._4_4_ = -(uint)(iVar59 < iVar41);
          auVar37._8_4_ = -(uint)(iVar61 < iVar42);
          auVar37._12_4_ = -(uint)(iVar63 < iVar43);
          auVar110 = blendvps(auVar111,auVar99,auVar37);
          auVar112 = blendvps(auVar113,auVar84,auVar37);
          auVar79._0_8_ = local_2b8._4_8_;
          auVar78._0_12_ = local_2b8._4_12_;
          auVar78._12_4_ = local_2b8._12_4_;
          uVar9 = auVar78._8_8_ & 0xffffffff | (ulong)(uint)ptr_04[uVar34 + 3] << 0x20;
          auVar79._8_8_ = uVar9;
          auVar85._12_4_ = local_2a8._12_4_;
          auVar86._0_8_ = local_2a8._4_8_;
          auVar85._0_12_ = local_2a8._4_12_;
          auVar86._8_8_ = auVar85._8_8_ & 0xffffffff | (ulong)(uint)ptr_08[uVar34 + 3] << 0x20;
          auVar87 = blendvps(auVar86,auVar79,auVar37);
          iVar100 = auVar103._0_4_ - open;
          iVar105 = iVar104 - open;
          iVar107 = iVar106 - open;
          iVar109 = iVar108 - open;
          iVar65 = local_1d8._0_4_ - gap;
          iVar71 = local_1d8._4_4_ - gap;
          iVar73 = local_1d8._8_4_ - gap;
          iVar75 = local_1d8._12_4_ - gap;
          auVar101._0_4_ = -(uint)(iVar65 < iVar100);
          auVar101._4_4_ = -(uint)(iVar71 < iVar105);
          auVar101._8_4_ = -(uint)(iVar73 < iVar107);
          auVar101._12_4_ = -(uint)(iVar75 < iVar109);
          auVar46 = blendvps(auVar46,auVar68,auVar101);
          auVar14._8_8_ = uStack_1c0;
          auVar14._0_8_ = local_1c8;
          auVar80._12_4_ = (uint)(uStack_1c0 >> 0x20);
          auVar80._0_12_ = auVar14._4_12_;
          uVar3 = ptr_00[uVar34 + 3];
          uVar92 = (uint)(iVar36 < iVar54) * iVar54 | (uint)(iVar36 >= iVar54) * iVar36;
          uVar94 = (uint)(iVar41 < iVar59) * iVar59 | (uint)(iVar41 >= iVar59) * iVar41;
          uVar95 = (uint)(iVar42 < iVar61) * iVar61 | (uint)(iVar42 >= iVar61) * iVar42;
          uVar97 = (uint)(iVar43 < iVar63) * iVar63 | (uint)(iVar43 >= iVar63) * iVar43;
          auVar88._0_4_ = (uint)(iVar100 < iVar65) * iVar65 | (uint)(iVar100 >= iVar65) * iVar100;
          auVar88._4_4_ = (uint)(iVar105 < iVar71) * iVar71 | (uint)(iVar105 >= iVar71) * iVar105;
          auVar88._8_4_ = (uint)(iVar107 < iVar73) * iVar73 | (uint)(iVar107 >= iVar73) * iVar107;
          auVar88._12_4_ = (uint)(iVar109 < iVar75) * iVar75 | (uint)(iVar109 >= iVar75) * iVar109;
          auVar77 = blendvps(auVar77,auVar66,auVar101);
          auVar76 = blendvps(auVar82,local_2b8,auVar101);
          uVar45 = iVar44 + piVar4[(long)(int)(uVar17 * iVar27) + (long)ptr_00[uVar34]];
          uVar50 = iVar49 + piVar4[(long)(int)(uVar28 * iVar27) + (long)ptr_00[uVar34 + 1]];
          uVar52 = iVar51 + piVar4[(long)(int)(uVar23 * iVar27) + (long)ptr_00[uVar34 + 2]];
          uVar53 = iVar33 + piVar4[(long)(int)(uVar32 * iVar27) + (long)(int)uVar3];
          uVar55 = ((int)uVar45 < (int)auVar88._0_4_) * auVar88._0_4_ |
                   ((int)uVar45 >= (int)auVar88._0_4_) * uVar45;
          uVar60 = ((int)uVar50 < (int)auVar88._4_4_) * auVar88._4_4_ |
                   ((int)uVar50 >= (int)auVar88._4_4_) * uVar50;
          uVar62 = ((int)uVar52 < (int)auVar88._8_4_) * auVar88._8_4_ |
                   ((int)uVar52 >= (int)auVar88._8_4_) * uVar52;
          uVar64 = ((int)uVar53 < (int)auVar88._12_4_) * auVar88._12_4_ |
                   ((int)uVar53 >= (int)auVar88._12_4_) * uVar53;
          auVar102._0_4_ =
               ((int)uVar55 < (int)uVar92) * uVar92 | ((int)uVar55 >= (int)uVar92) * uVar55;
          auVar102._4_4_ =
               ((int)uVar60 < (int)uVar94) * uVar94 | ((int)uVar60 >= (int)uVar94) * uVar60;
          auVar102._8_4_ =
               ((int)uVar62 < (int)uVar95) * uVar95 | ((int)uVar62 >= (int)uVar95) * uVar62;
          auVar102._12_4_ =
               ((int)uVar64 < (int)uVar97) * uVar97 | ((int)uVar64 >= (int)uVar97) * uVar64;
          auVar56._0_4_ = -(uint)((int)uVar92 < (int)uVar55);
          auVar56._4_4_ = -(uint)((int)uVar94 < (int)uVar60);
          auVar56._8_4_ = -(uint)((int)uVar95 < (int)uVar62);
          auVar56._12_4_ = -(uint)((int)uVar97 < (int)uVar64);
          auVar66 = blendvps(auVar110,auVar46,auVar56);
          auVar47._0_4_ = -(uint)(uVar45 == auVar102._0_4_);
          auVar47._4_4_ = -(uint)(uVar50 == auVar102._4_4_);
          auVar47._8_4_ = -(uint)(uVar52 == auVar102._8_4_);
          auVar47._12_4_ = -(uint)(uVar53 == auVar102._12_4_);
          auVar69._0_4_ = local_1e8._0_4_ + (uint)(uVar13 == (uint)((ulong)local_1c8 >> 0x20));
          auVar69._4_4_ = local_1e8._4_4_ + (uint)(uVar12 == (uint)uStack_1c0);
          auVar69._8_4_ = local_1e8._8_4_ + (uint)(uVar11 == auVar80._12_4_);
          auVar69._12_4_ = local_1e8._12_4_ + (uint)(uVar10 == uVar3);
          auVar68 = blendvps(auVar66,auVar69,auVar47);
          auVar66 = blendvps(auVar112,auVar77,auVar56);
          auVar70._0_4_ =
               local_1f8._0_4_ +
               (uint)(0 < piVar4[(long)(int)(uVar17 * iVar27) + (long)ptr_00[uVar34]]);
          auVar70._4_4_ =
               local_1f8._4_4_ +
               (uint)(0 < piVar4[(long)(int)(uVar28 * iVar27) + (long)ptr_00[uVar34 + 1]]);
          auVar70._8_4_ =
               local_1f8._8_4_ +
               (uint)(0 < piVar4[(long)(int)(uVar23 * iVar27) + (long)ptr_00[uVar34 + 2]]);
          auVar70._12_4_ =
               local_1f8._12_4_ +
               (uint)(0 < piVar4[(long)(int)(uVar32 * iVar27) + (long)(int)uVar3]);
          auVar66 = blendvps(auVar66,auVar70,auVar47);
          local_2a8._0_4_ = auVar87._0_4_ + 1;
          local_2a8._4_4_ = auVar87._4_4_ + 1;
          local_2a8._8_4_ = auVar87._8_4_ + 1;
          local_2a8._12_4_ = auVar87._12_4_ + 1;
          auVar82._0_4_ = auVar76._0_4_ + 1;
          auVar82._4_4_ = auVar76._4_4_ + 1;
          auVar82._8_4_ = auVar76._8_4_ + 1;
          auVar82._12_4_ = auVar76._12_4_ + 1;
          auVar76 = blendvps(local_2a8,auVar82,auVar56);
          local_278 = (int)uVar81;
          iStack_274 = (int)((ulong)uVar81 >> 0x20);
          iStack_270 = (int)uVar25;
          iStack_26c = (int)(uVar25 >> 0x20);
          auVar57._0_4_ = local_278 + 1;
          auVar57._4_4_ = iStack_274 + 1;
          auVar57._8_4_ = iStack_270 + 1;
          auVar57._12_4_ = iStack_26c + 1;
          local_2b8 = blendvps(auVar76,auVar57,auVar47);
          auVar38._0_4_ = -(uint)(local_2c8 == -1);
          auVar38._4_4_ = -(uint)(iStack_2c4 == -1);
          auVar38._8_4_ = -(uint)(iStack_2c0 == -1);
          auVar38._12_4_ = -(uint)(iStack_2bc == -1);
          auVar103._4_4_ = iStack_244;
          auVar103._0_4_ = local_248;
          auVar103._8_4_ = iStack_240;
          auVar103._12_4_ = iStack_23c;
          auVar103 = blendvps(auVar102,auVar103,auVar38);
          auVar68 = ~auVar38 & auVar68;
          auVar66 = ~auVar38 & auVar66;
          local_2b8 = ~auVar38 & local_2b8;
          auVar87._4_4_ = uVar31;
          auVar87._0_4_ = uVar31;
          auVar87._8_4_ = uVar31;
          auVar87._12_4_ = uVar31;
          local_1d8 = blendvps(auVar88,auVar87,auVar38);
          iVar44 = auVar103._0_4_;
          iVar51 = auVar68._0_4_;
          iVar49 = local_2b8._0_4_;
          iVar36 = auVar66._0_4_;
          if (3 < uVar34) {
            local_268 = (uint)(iVar44 < (int)local_268) * iVar44 |
                        (iVar44 >= (int)local_268) * local_268;
            iVar41 = auVar103._4_4_;
            uStack_264 = (uint)(iVar41 < (int)uStack_264) * iVar41 |
                         (iVar41 >= (int)uStack_264) * uStack_264;
            iVar42 = auVar103._8_4_;
            uStack_260 = (uint)(iVar42 < (int)uStack_260) * iVar42 |
                         (iVar42 >= (int)uStack_260) * uStack_260;
            iVar43 = auVar103._12_4_;
            uStack_25c = (uint)(iVar43 < (int)uStack_25c) * iVar43 |
                         (iVar43 >= (int)uStack_25c) * uStack_25c;
            uVar45 = (uint)((int)local_258._0_4_ < iVar44) * iVar44 |
                     (uint)((int)local_258._0_4_ >= iVar44) * local_258._0_4_;
            uVar50 = (uint)((int)local_258._4_4_ < iVar41) * iVar41 |
                     (uint)((int)local_258._4_4_ >= iVar41) * local_258._4_4_;
            uVar52 = (uint)((int)local_258._8_4_ < iVar42) * iVar42 |
                     (uint)((int)local_258._8_4_ >= iVar42) * local_258._8_4_;
            uVar53 = (uint)((int)local_258._12_4_ < iVar43) * iVar43 |
                     (uint)((int)local_258._12_4_ >= iVar43) * local_258._12_4_;
            uVar55 = (uint)((int)uVar45 < iVar51) * iVar51 | ((int)uVar45 >= iVar51) * uVar45;
            iVar41 = auVar68._4_4_;
            uVar60 = (uint)((int)uVar50 < iVar41) * iVar41 | ((int)uVar50 >= iVar41) * uVar50;
            iVar41 = auVar68._8_4_;
            uVar62 = (uint)((int)uVar52 < iVar41) * iVar41 | ((int)uVar52 >= iVar41) * uVar52;
            iVar41 = auVar68._12_4_;
            uVar64 = (uint)((int)uVar53 < iVar41) * iVar41 | ((int)uVar53 >= iVar41) * uVar53;
            uVar45 = (uint)(iVar36 < iVar49) * iVar49 | (uint)(iVar36 >= iVar49) * iVar36;
            iVar41 = local_2b8._4_4_;
            iVar42 = auVar66._4_4_;
            uVar50 = (uint)(iVar42 < iVar41) * iVar41 | (uint)(iVar42 >= iVar41) * iVar42;
            iVar41 = local_2b8._8_4_;
            iVar42 = auVar66._8_4_;
            iVar43 = auVar66._12_4_;
            uVar52 = (uint)(iVar42 < iVar41) * iVar41 | (uint)(iVar42 >= iVar41) * iVar42;
            iVar41 = local_2b8._12_4_;
            uVar53 = (uint)(iVar43 < iVar41) * iVar41 | (uint)(iVar43 >= iVar41) * iVar43;
            local_258._4_4_ =
                 ((int)uVar60 < (int)uVar50) * uVar50 | ((int)uVar60 >= (int)uVar50) * uVar60;
            local_258._0_4_ =
                 ((int)uVar55 < (int)uVar45) * uVar45 | ((int)uVar55 >= (int)uVar45) * uVar55;
            local_258._8_4_ =
                 ((int)uVar62 < (int)uVar52) * uVar52 | ((int)uVar62 >= (int)uVar52) * uVar62;
            local_258._12_4_ =
                 ((int)uVar64 < (int)uVar53) * uVar53 | ((int)uVar64 >= (int)uVar53) * uVar64;
          }
          auVar46 = ~auVar38 & auVar46;
          auVar77 = ~auVar38 & auVar77;
          auVar82 = ~auVar38 & auVar82;
          puVar5 = (undefined8 *)((ppVar19->field_4).trace)->trace_del_table;
          vWH[0] = uVar24 & 0xffffffff;
          iVar33 = (int32_t)uVar34;
          vWH[1]._0_4_ = _s1Len;
          vWH[1]._4_4_ = 0;
          arr_store_rowcol((int *)*puVar5,(int *)puVar5[4],vWH,iVar33,s2Len,
                           in_stack_fffffffffffffca8,(int32_t)ptr_07);
          pvVar6 = ((ppVar19->field_4).trace)->trace_del_table;
          vWH_00[0] = uVar24 & 0xffffffff;
          vWH_00[1]._0_4_ = _s1Len;
          vWH_00[1]._4_4_ = 0;
          arr_store_rowcol(*(int **)((long)pvVar6 + 8),*(int **)((long)pvVar6 + 0x28),vWH_00,iVar33,
                           s2Len,in_stack_fffffffffffffca8,(int32_t)ptr_07);
          pvVar6 = ((ppVar19->field_4).trace)->trace_del_table;
          vWH_01[0] = uVar24 & 0xffffffff;
          vWH_01[1]._0_4_ = _s1Len;
          vWH_01[1]._4_4_ = 0;
          arr_store_rowcol(*(int **)((long)pvVar6 + 0x10),*(int **)((long)pvVar6 + 0x30),vWH_01,
                           iVar33,s2Len,in_stack_fffffffffffffca8,(int32_t)ptr_07);
          pvVar6 = ((ppVar19->field_4).trace)->trace_del_table;
          vWH_02[0] = uVar24 & 0xffffffff;
          vWH_02[1]._0_4_ = _s1Len;
          vWH_02[1]._4_4_ = 0;
          arr_store_rowcol(*(int **)((long)pvVar6 + 0x18),*(int **)((long)pvVar6 + 0x38),vWH_02,
                           iVar33,s2Len,in_stack_fffffffffffffca8,(int32_t)ptr_07);
          auVar39._0_4_ = -(uint)(local_2c8 == iVar30);
          auVar39._4_4_ = -(uint)(iStack_2c4 == iVar30);
          auVar39._8_4_ = -(uint)(iStack_2c0 == iVar30);
          auVar39._12_4_ = -(uint)(iStack_2bc == iVar30);
          auVar15._4_4_ = -(uint)(uVar18 == local_32c);
          auVar15._0_4_ = -(uint)(auVar67._0_4_ == local_32c);
          auVar15._8_4_ = -(uint)(uVar72 == local_32c);
          auVar15._12_4_ = -(uint)(uVar74 == local_32c);
          auVar39 = auVar39 & auVar15;
          auVar58 = blendvps(auVar58,auVar103,auVar39);
          auVar89 = blendvps(auVar89,auVar68,auVar39);
          auVar90 = blendvps(auVar90,auVar66,auVar39);
          auVar93 = blendvps(auVar93,local_2b8,auVar39);
          ptr_01[uVar34] = iVar44;
          ptr_02[uVar34] = iVar51;
          ptr_03[uVar34] = iVar36;
          ptr_04[uVar34] = iVar49;
          auVar76._4_4_ = uVar94;
          auVar76._0_4_ = uVar92;
          auVar76._8_4_ = uVar95;
          auVar76._12_4_ = uVar97;
          ptr_05[uVar34] = uVar92;
          ptr_06[uVar34] = auVar110._0_4_;
          ptr_07[uVar34] = auVar112._0_4_;
          ptr_08[uVar34] = local_2a8._0_4_;
          local_2c8 = local_2c8 + 1;
          iStack_2c4 = iStack_2c4 + 1;
          iStack_2c0 = iStack_2c0 + 1;
          iStack_2bc = iStack_2bc + 1;
          local_1e8._8_8_ = uVar7;
          local_1e8._0_8_ = auVar99._0_8_;
          local_1f8._8_8_ = uVar8;
          local_1f8._0_8_ = auVar84._0_8_;
          iVar44 = iVar104;
          iVar49 = iVar106;
          iVar51 = iVar108;
          iVar33 = iVar2;
          uVar81 = auVar79._0_8_;
          uVar25 = uVar9;
          local_1c8 = auVar14._4_8_;
          uStack_1c0 = auVar80._8_8_ & 0xffffffff | (ulong)uVar3 << 0x20;
        }
        auVar67._0_4_ = auVar67._0_4_ + 4;
        auVar67._4_4_ = uVar18 + 4;
        auVar67._8_4_ = uVar72 + 4;
        auVar67._12_4_ = uVar74 + 4;
        local_248 = local_248 + gap * -4;
        iStack_244 = iStack_244 + gap * -4;
        iStack_240 = iStack_240 + gap * -4;
        iStack_23c = iStack_23c + gap * -4;
        uVar24 = uVar24 + 4;
      }
      iVar29 = 4;
      uVar32 = uVar31;
      uVar18 = uVar31;
      uVar23 = uVar31;
      uVar28 = uVar31;
      while (bVar35 = iVar29 != 0, iVar29 = iVar29 + -1, bVar35) {
        uVar20 = auVar58._0_8_;
        lVar22 = auVar58._8_8_;
        uVar24 = auVar89._0_8_;
        lVar21 = auVar89._8_8_;
        uVar25 = auVar90._0_8_;
        lVar91 = auVar90._8_8_;
        uVar34 = auVar93._0_8_;
        lVar96 = auVar93._8_8_;
        if ((int)uVar32 < (int)auVar58._12_4_) {
          uVar18 = auVar89._12_4_;
          uVar23 = auVar90._12_4_;
          uVar28 = auVar93._12_4_;
          uVar32 = auVar58._12_4_;
        }
        auVar58._0_8_ = uVar20 << 0x20;
        auVar58._8_8_ = lVar22 << 0x20 | uVar20 >> 0x20;
        auVar89._0_8_ = uVar24 << 0x20;
        auVar89._8_8_ = lVar21 << 0x20 | uVar24 >> 0x20;
        auVar90._0_8_ = uVar25 << 0x20;
        auVar90._8_8_ = lVar91 << 0x20 | uVar25 >> 0x20;
        auVar93._0_8_ = uVar34 << 0x20;
        auVar93._8_8_ = lVar96 << 0x20 | uVar34 >> 0x20;
      }
      auVar40._0_4_ = -(uint)((int)local_268 < (int)uVar31);
      auVar40._4_4_ = -(uint)((int)uStack_264 < (int)uVar31);
      auVar40._8_4_ = -(uint)((int)uStack_260 < (int)uVar31);
      auVar40._12_4_ = -(uint)((int)uStack_25c < (int)uVar31);
      auVar48._0_4_ = -(uint)((int)uVar16 < (int)local_258._0_4_);
      auVar48._4_4_ = -(uint)((int)uVar16 < (int)local_258._4_4_);
      auVar48._8_4_ = -(uint)((int)uVar16 < (int)local_258._8_4_);
      auVar48._12_4_ = -(uint)((int)uVar16 < (int)local_258._12_4_);
      iVar29 = movmskps(iVar29,auVar48 | auVar40);
      if (iVar29 != 0) {
        *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
        uVar32 = 0;
        uVar18 = 0;
        uVar23 = 0;
        uVar28 = 0;
        iVar30 = 0;
        local_32c = 0;
      }
      ppVar19->score = uVar32;
      ppVar19->end_query = local_32c;
      ppVar19->end_ref = iVar30;
      ((ppVar19->field_4).stats)->matches = uVar18;
      ((ppVar19->field_4).stats)->similar = uVar23;
      ((ppVar19->field_4).stats)->length = uVar28;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar19;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _HM_pr = NULL;
    int32_t * restrict _HS_pr = NULL;
    int32_t * restrict _HL_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict _FM_pr = NULL;
    int32_t * restrict _FS_pr = NULL;
    int32_t * restrict _FL_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict HM_pr = NULL;
    int32_t * restrict HS_pr = NULL;
    int32_t * restrict HL_pr = NULL;
    int32_t * restrict F_pr = NULL;
    int32_t * restrict FM_pr = NULL;
    int32_t * restrict FS_pr = NULL;
    int32_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vNegInf0 = _mm_insert_epi32(vZero, NEG_LIMIT, 3);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int32_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi32(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vNM = _mm_srli_si128(vWM, 4);
            vNM = _mm_insert_epi32(vNM, HM_pr[j], 3);
            vNS = _mm_srli_si128(vWS, 4);
            vNS = _mm_insert_epi32(vNS, HS_pr[j], 3);
            vNL = _mm_srli_si128(vWL, 4);
            vNL = _mm_insert_epi32(vNL, HL_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vFM = _mm_srli_si128(vFM, 4);
            vFM = _mm_insert_epi32(vFM, FM_pr[j], 3);
            vFS = _mm_srli_si128(vFS, 4);
            vFS = _mm_insert_epi32(vFS, FS_pr[j], 3);
            vFL = _mm_srli_si128(vFL, 4);
            vFL = _mm_insert_epi32(vFL, FL_pr[j], 3);
            vF_opn = _mm_sub_epi32(vNH, vOpen);
            vF_ext = _mm_sub_epi32(vF, vGap);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vE_opn = _mm_sub_epi32(vWH, vOpen);
            vE_ext = _mm_sub_epi32(vE, vGap);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 4);
            vs2 = _mm_insert_epi32(vs2, s2[j], 3);
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            case1 = _mm_cmpeq_epi32(vWH, vNWH);
            case2 = _mm_cmpeq_epi32(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi32(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi32(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            HM_pr[j-3] = (int32_t)_mm_extract_epi32(vWM,0);
            HS_pr[j-3] = (int32_t)_mm_extract_epi32(vWS,0);
            HL_pr[j-3] = (int32_t)_mm_extract_epi32(vWL,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            FM_pr[j-3] = (int32_t)_mm_extract_epi32(vFM,0);
            FS_pr[j-3] = (int32_t)_mm_extract_epi32(vFS,0);
            FL_pr[j-3] = (int32_t)_mm_extract_epi32(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int32_t) _mm_extract_epi32(vMaxM, 3);
            similar = (int32_t) _mm_extract_epi32(vMaxS, 3);
            length= (int32_t) _mm_extract_epi32(vMaxL, 3);
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
        vMaxM = _mm_slli_si128(vMaxM, 4);
        vMaxS = _mm_slli_si128(vMaxS, 4);
        vMaxL = _mm_slli_si128(vMaxL, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}